

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgtextelement.cpp
# Opt level: O1

void __thiscall
lunasvg::SVGTextFragmentsBuilder::handleElement
          (SVGTextFragmentsBuilder *this,SVGTextPositioningElement *element)

{
  pointer pSVar1;
  pointer pSVar2;
  SVGTextNode *node;
  SVGTextPositioningElement *element_00;
  pointer pSVar3;
  SVGGraphicsElement *pSVar4;
  char cVar5;
  int iVar6;
  _List_node_base *p_Var7;
  SVGTextPositioningElement *local_48;
  size_type local_40;
  size_type local_38;
  
  pSVar1 = (this->m_textPositions).
           super__Vector_base<lunasvg::SVGTextPosition,_std::allocator<lunasvg::SVGTextPosition>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pSVar2 = (this->m_textPositions).
           super__Vector_base<lunasvg::SVGTextPosition,_std::allocator<lunasvg::SVGTextPosition>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_40 = this->m_text->_M_string_length;
  local_48 = element;
  local_38 = local_40;
  std::vector<lunasvg::SVGTextPosition,std::allocator<lunasvg::SVGTextPosition>>::
  emplace_back<lunasvg::SVGTextPositioningElement_const*&,unsigned_long,unsigned_long>
            ((vector<lunasvg::SVGTextPosition,std::allocator<lunasvg::SVGTextPosition>> *)
             &this->m_textPositions,&local_48,&local_38,&local_40);
  p_Var7 = (local_48->super_SVGGraphicsElement).super_SVGElement.m_children.
           super__List_base<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>,_std::allocator<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  pSVar4 = &local_48->super_SVGGraphicsElement;
  do {
    if (p_Var7 == (_List_node_base *)&(pSVar4->super_SVGElement).m_children) {
      pSVar3 = (this->m_textPositions).
               super__Vector_base<lunasvg::SVGTextPosition,_std::allocator<lunasvg::SVGTextPosition>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (*(SVGTextPositioningElement **)((long)pSVar1 + ((long)pSVar3 - (long)pSVar2)) == local_48)
      {
        *(size_type *)((long)pSVar1 + (long)pSVar3 + (0x10 - (long)pSVar2)) =
             this->m_text->_M_string_length;
        return;
      }
      __assert_fail("position.node == element",
                    "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/source/svgtextelement.cpp"
                    ,0x144,
                    "void lunasvg::SVGTextFragmentsBuilder::handleElement(const SVGTextPositioningElement *)"
                   );
    }
    cVar5 = (**(code **)((long)(p_Var7[1]._M_next)->_M_next + 0x10))();
    node = (SVGTextNode *)p_Var7[1]._M_next;
    if (cVar5 == '\0') {
      iVar6 = (*(node->super_SVGNode)._vptr_SVGNode[7])(node);
      if ((char)iVar6 != '\0') {
        element_00 = (SVGTextPositioningElement *)p_Var7[1]._M_next;
        if (element_00 == (SVGTextPositioningElement *)0x0) {
LAB_001216c1:
          __assert_fail("node && node->isTextPositioningElement()",
                        "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/source/svgtextelement.cpp"
                        ,0x11,
                        "const SVGTextPositioningElement *lunasvg::toSVGTextPositioningElement(const SVGNode *)"
                       );
        }
        iVar6 = (*(element_00->super_SVGGraphicsElement).super_SVGElement.super_SVGNode.
                  _vptr_SVGNode[7])(element_00);
        if ((char)iVar6 == '\0') goto LAB_001216c1;
        handleElement(this,element_00);
      }
    }
    else {
      if (node == (SVGTextNode *)0x0) {
LAB_001216a2:
        __assert_fail("node && node->isTextNode()",
                      "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/source/svgtextelement.cpp"
                      ,0xb,"const SVGTextNode *lunasvg::toSVGTextNode(const SVGNode *)");
      }
      iVar6 = (*(node->super_SVGNode)._vptr_SVGNode[2])(node);
      if ((char)iVar6 == '\0') goto LAB_001216a2;
      handleText(this,node);
    }
    p_Var7 = p_Var7->_M_next;
  } while( true );
}

Assistant:

void SVGTextFragmentsBuilder::handleElement(const SVGTextPositioningElement* element)
{
    const auto itemIndex = m_textPositions.size();
    m_textPositions.emplace_back(element, m_text.length(), m_text.length());
    for(const auto& child : element->children()) {
        if(child->isTextNode()) {
            handleText(toSVGTextNode(child.get()));
        } else if(child->isTextPositioningElement()) {
            handleElement(toSVGTextPositioningElement(child.get()));
        }
    }

    auto& position = m_textPositions[itemIndex];
    assert(position.node == element);
    position.endOffset = m_text.length();
}